

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O0

void __thiscall
osqp::anon_unknown_0::TwoDimensionalQpTest::~TwoDimensionalQpTest(TwoDimensionalQpTest *this)

{
  TwoDimensionalQpTest *this_local;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TwoDimensionalQpTest_0031e2a8;
  OsqpSolver::~OsqpSolver(&this->solver_);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

void SetUp() override {
    // Minimize x^2 + (1/2)xy + y^2 subject to x >= 1.
    SparseMatrix<double> objective_matrix(2, 2);
    const Triplet<double> kTripletsP[] = {
        {0, 0, 2.0}, {1, 0, 0.5}, {0, 1, 0.5}, {1, 1, 2.0}};
    objective_matrix.setFromTriplets(std::begin(kTripletsP),
                                     std::end(kTripletsP));

    SparseMatrix<double> constraint_matrix(1, 2);
    const Triplet<double> kTripletsA[] = {{0, 0, 1.0}};
    constraint_matrix.setFromTriplets(std::begin(kTripletsA),
                                      std::end(kTripletsA));

    OsqpInstance instance;
    instance.objective_matrix = objective_matrix;
    instance.objective_vector.resize(2);
    instance.objective_vector << 0.0, 0.0;
    instance.constraint_matrix = constraint_matrix;
    instance.lower_bounds.resize(1);
    instance.lower_bounds << 1.0;
    instance.upper_bounds.resize(1);
    instance.upper_bounds << kInfinity;

    OsqpSettings settings;
    settings.eps_abs = kTolerance / 10;
    settings.eps_rel = 0.0;
    // check_termination is set so that the warm-started instance converges
    // immediately.
    settings.check_termination = 1;
    ASSERT_TRUE(solver_.Init(instance, settings).ok());
  }